

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice.cpp
# Opt level: O2

int __thiscall
ncnn::Slice::forward
          (Slice *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  Mat *pMVar1;
  uint uVar2;
  Mat *this_00;
  size_t _elemsize;
  void *pvVar3;
  pointer pMVar4;
  size_t sVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  void *__src;
  int p;
  int iVar12;
  int _c;
  long lVar13;
  long lVar14;
  size_t i;
  ulong uVar15;
  void *pvVar16;
  int j;
  int iVar17;
  int iVar18;
  size_t i_1;
  int j_1;
  long local_e0;
  Mat m;
  
  this_00 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar2 = this_00->dims;
  _elemsize = this_00->elemsize;
  pvVar3 = (this->slices).data;
  if (uVar2 == 1) {
    iVar9 = this_00->w;
    lVar14 = 0;
    lVar13 = 0;
    uVar15 = 0;
    iVar17 = 0;
    while( true ) {
      pMVar4 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar7 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pMVar4) / 0x48;
      if (uVar7 <= uVar15) break;
      iVar12 = *(int *)((long)pvVar3 + uVar15 * 4);
      if (iVar12 == -0xe9) {
        iVar12 = (int)((ulong)((long)iVar9 - (long)iVar17) / (uVar7 + lVar14));
      }
      Mat::create((Mat *)((long)&pMVar4->data + lVar13),iVar12,_elemsize,opt->blob_allocator);
      pvVar16 = *(void **)((long)&pMVar4->data + lVar13);
      if ((pvVar16 == (void *)0x0) ||
         ((long)*(int *)((long)&pMVar4->c + lVar13) * *(long *)((long)&pMVar4->cstep + lVar13) == 0)
         ) {
        return -100;
      }
      memcpy(pvVar16,(void *)(_elemsize * (long)iVar17 + (long)this_00->data),
             (long)iVar12 * _elemsize);
      iVar17 = iVar17 + iVar12;
      uVar15 = uVar15 + 1;
      lVar13 = lVar13 + 0x48;
      lVar14 = lVar14 + -1;
    }
  }
  else {
    iVar9 = (this->axis >> 0x1f & uVar2) + this->axis;
    if ((uVar2 == 2) && (iVar9 == 0)) {
      iVar9 = this_00->w;
      iVar17 = this_00->h;
      lVar13 = 0;
      lVar14 = 0;
      uVar15 = 0;
      iVar12 = 0;
      while( true ) {
        pMVar4 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar7 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar4) / 0x48;
        if (uVar7 <= uVar15) break;
        iVar11 = *(int *)((long)pvVar3 + uVar15 * 4);
        if (iVar11 == -0xe9) {
          iVar11 = (int)((ulong)((long)iVar17 - (long)iVar12) / (uVar7 + lVar13));
        }
        Mat::create((Mat *)((long)&pMVar4->data + lVar14),iVar9,iVar11,_elemsize,opt->blob_allocator
                   );
        pvVar16 = *(void **)((long)&pMVar4->data + lVar14);
        if (pvVar16 == (void *)0x0) {
          return -100;
        }
        if ((long)*(int *)((long)&pMVar4->c + lVar14) * *(long *)((long)&pMVar4->cstep + lVar14) ==
            0) {
          return -100;
        }
        memcpy(pvVar16,(void *)((long)this_00->w * (long)iVar12 * this_00->elemsize +
                               (long)this_00->data),(long)(iVar11 * iVar9) * _elemsize);
        iVar12 = iVar12 + iVar11;
        uVar15 = uVar15 + 1;
        lVar14 = lVar14 + 0x48;
        lVar13 = lVar13 + -1;
      }
    }
    else if ((uVar2 == 2) && (iVar9 == 1)) {
      iVar9 = this_00->w;
      uVar2 = this_00->h;
      uVar15 = 0;
      if (0 < (int)uVar2) {
        uVar15 = (ulong)uVar2;
      }
      uVar7 = 0;
      iVar17 = 0;
      while( true ) {
        pMVar4 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar8 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar4) / 0x48;
        uVar10 = uVar8 - uVar7;
        if (uVar8 < uVar7 || uVar10 == 0) break;
        iVar12 = *(int *)((long)pvVar3 + uVar7 * 4);
        if (iVar12 == -0xe9) {
          iVar12 = (int)((ulong)((long)iVar9 - (long)iVar17) / uVar10);
        }
        pMVar1 = pMVar4 + uVar7;
        Mat::create(pMVar1,iVar12,uVar2,_elemsize,opt->blob_allocator);
        if (pMVar4[uVar7].data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar1->c * pMVar1->cstep == 0) {
          return -100;
        }
        for (uVar8 = 0; uVar15 != uVar8; uVar8 = uVar8 + 1) {
          memcpy((void *)((long)pMVar1->w * uVar8 * pMVar1->elemsize + (long)pMVar1->data),
                 (void *)((long)this_00->data +
                         (long)iVar17 * _elemsize + (long)this_00->w * uVar8 * this_00->elemsize),
                 (long)iVar12 * _elemsize);
        }
        iVar17 = iVar12 + iVar17;
        uVar7 = uVar7 + 1;
      }
    }
    else if ((uVar2 == 3) && (iVar9 == 0)) {
      iVar9 = this_00->w;
      iVar17 = this_00->h;
      iVar12 = this_00->c;
      local_e0 = 0;
      lVar13 = 0;
      uVar15 = 0;
      iVar11 = 0;
      while( true ) {
        pMVar4 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar7 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar4) / 0x48;
        if (uVar7 <= uVar15) break;
        iVar6 = *(int *)((long)pvVar3 + uVar15 * 4);
        if (iVar6 == -0xe9) {
          iVar6 = (int)((ulong)((long)iVar12 - (long)iVar11) / (uVar7 + local_e0));
        }
        pMVar1 = (Mat *)((long)&pMVar4->data + lVar13);
        Mat::create(pMVar1,iVar9,iVar17,iVar6,_elemsize,opt->blob_allocator);
        if (*(long *)((long)&pMVar4->data + lVar13) == 0) {
          return -100;
        }
        if ((long)*(int *)((long)&pMVar4->c + lVar13) * *(long *)((long)&pMVar4->cstep + lVar13) ==
            0) {
          return -100;
        }
        sVar5 = this_00->cstep;
        Mat::channel(&m,this_00,iVar11);
        pvVar16 = m.data;
        Mat::~Mat(&m);
        memcpy(pMVar1->data,pvVar16,(long)((int)sVar5 * iVar6) * _elemsize);
        iVar11 = iVar6 + iVar11;
        uVar15 = uVar15 + 1;
        lVar13 = lVar13 + 0x48;
        local_e0 = local_e0 + -1;
      }
    }
    else if ((uVar2 == 3) && (iVar9 == 1)) {
      iVar9 = this_00->w;
      iVar17 = this_00->c;
      iVar12 = this_00->h;
      iVar11 = 0;
      if (0 < iVar17) {
        iVar11 = iVar17;
      }
      iVar6 = 0;
      uVar15 = 0;
      while( true ) {
        pMVar4 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar7 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar4) / 0x48;
        uVar8 = uVar7 - uVar15;
        if (uVar7 < uVar15 || uVar8 == 0) break;
        iVar18 = *(int *)((long)pvVar3 + uVar15 * 4);
        if (iVar18 == -0xe9) {
          iVar18 = (int)((ulong)((long)iVar12 - (long)iVar6) / uVar8);
        }
        pMVar1 = pMVar4 + uVar15;
        Mat::create(pMVar1,iVar9,iVar18,iVar17,_elemsize,opt->blob_allocator);
        if (pMVar4[uVar15].data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar1->c * pMVar1->cstep == 0) {
          return -100;
        }
        for (_c = 0; iVar11 != _c; _c = _c + 1) {
          Mat::channel(&m,pMVar1,_c);
          pvVar16 = m.data;
          Mat::~Mat(&m);
          Mat::channel(&m,this_00,_c);
          __src = (void *)((long)m.w * (long)iVar6 * m.elemsize + (long)m.data);
          Mat::~Mat(&m);
          memcpy(pvVar16,__src,(long)(iVar18 * iVar9) * _elemsize);
        }
        iVar6 = iVar18 + iVar6;
        uVar15 = uVar15 + 1;
      }
    }
    else {
      if (uVar2 != 3) {
        return 0;
      }
      if (iVar9 != 2) {
        return 0;
      }
      iVar9 = this_00->w;
      uVar2 = this_00->h;
      iVar17 = this_00->c;
      uVar15 = 0;
      if (0 < (int)uVar2) {
        uVar15 = (ulong)uVar2;
      }
      iVar12 = 0;
      if (0 < iVar17) {
        iVar12 = iVar17;
      }
      iVar11 = 0;
      uVar7 = 0;
      while( true ) {
        pMVar4 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar8 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar4) / 0x48;
        uVar10 = uVar8 - uVar7;
        if (uVar8 < uVar7 || uVar10 == 0) break;
        iVar6 = *(int *)((long)pvVar3 + uVar7 * 4);
        if (iVar6 == -0xe9) {
          iVar6 = (int)((ulong)((long)iVar9 - (long)iVar11) / uVar10);
        }
        pMVar1 = pMVar4 + uVar7;
        Mat::create(pMVar1,iVar6,uVar2,iVar17,_elemsize,opt->blob_allocator);
        if (pMVar4[uVar7].data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar1->c * pMVar1->cstep == 0) {
          return -100;
        }
        for (iVar18 = 0; iVar18 != iVar12; iVar18 = iVar18 + 1) {
          Mat::channel(&m,pMVar1,iVar18);
          pvVar16 = m.data;
          Mat::~Mat(&m);
          Mat::channel(&m,this_00,iVar18);
          for (uVar8 = 0; uVar15 != uVar8; uVar8 = uVar8 + 1) {
            memcpy(pvVar16,(void *)((long)m.data +
                                   (long)iVar11 * _elemsize + (long)m.w * uVar8 * m.elemsize),
                   (long)iVar6 * _elemsize);
            pvVar16 = (void *)((long)pvVar16 + (long)iVar6 * _elemsize);
          }
          Mat::~Mat(&m);
        }
        iVar11 = iVar6 + iVar11;
        uVar7 = uVar7 + 1;
      }
    }
  }
  return 0;
}

Assistant:

int Slice::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    const int* slices_ptr = slices;
    int positive_axis = axis < 0 ? dims + axis : axis;

    if (dims == 1) // positive_axis == 0
    {
        int w = bottom_blob.w;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((w - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            const unsigned char* ptr = (const unsigned char*)bottom_blob + q * elemsize;
            unsigned char* outptr = top_blob;
            memcpy(outptr, ptr, slice * elemsize);

            q += slice;
        }

        return 0;
    }

    if (dims == 2 && positive_axis == 0)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((h - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            int size = w * slice;

            const unsigned char* ptr = bottom_blob.row<const unsigned char>(q);
            unsigned char* outptr = top_blob;
            memcpy(outptr, ptr, size * elemsize);

            q += slice;
        }

        return 0;
    }

    if (dims == 2 && positive_axis == 1)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((w - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int j = 0; j < h; j++)
            {
                unsigned char* outptr = top_blob.row<unsigned char>(j);
                const unsigned char* ptr = bottom_blob.row<const unsigned char>(j) + q * elemsize;
                memcpy(outptr, ptr, slice * elemsize);
            }

            q += slice;
        }

        return 0;
    }

    if (dims == 3 && positive_axis == 0)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((channels - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, h, slice, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            int size = static_cast<int>(bottom_blob.cstep * slice);

            const unsigned char* ptr = bottom_blob.channel(q);
            unsigned char* outptr = top_blob;
            memcpy(outptr, ptr, size * elemsize);

            q += slice;
        }

        return 0;
    }

    if (dims == 3 && positive_axis == 1)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((h - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice, channels, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < channels; p++)
            {
                int size = w * slice;

                unsigned char* outptr = top_blob.channel(p);
                const unsigned char* ptr = bottom_blob.channel(p).row<const unsigned char>(q);
                memcpy(outptr, ptr, size * elemsize);
            }

            q += slice;
        }

        return 0;
    }

    if (dims == 3 && positive_axis == 2)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((w - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, channels, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < channels; p++)
            {
                unsigned char* outptr = top_blob.channel(p);
                const Mat m = bottom_blob.channel(p);

                for (int j = 0; j < h; j++)
                {
                    const unsigned char* ptr = m.row<const unsigned char>(j) + q * elemsize;
                    memcpy(outptr, ptr, slice * elemsize);

                    outptr += slice * elemsize;
                }
            }

            q += slice;
        }

        return 0;
    }

    return 0;
}